

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O3

void __thiscall
icu_63::AnnualTimeZoneRule::AnnualTimeZoneRule(AnnualTimeZoneRule *this,AnnualTimeZoneRule *source)

{
  int32_t iVar1;
  DateTimeRule *this_00;
  AnnualTimeZoneRule *size;
  
  size = source;
  TimeZoneRule::TimeZoneRule(&this->super_TimeZoneRule,&source->super_TimeZoneRule);
  (this->super_TimeZoneRule).super_UObject._vptr_UObject =
       (_func_int **)&PTR__AnnualTimeZoneRule_003a45e0;
  this_00 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
  if (this_00 != (DateTimeRule *)0x0) {
    DateTimeRule::DateTimeRule(this_00,source->fDateTimeRule);
  }
  this->fDateTimeRule = this_00;
  iVar1 = source->fEndYear;
  this->fStartYear = source->fStartYear;
  this->fEndYear = iVar1;
  return;
}

Assistant:

AnnualTimeZoneRule::AnnualTimeZoneRule(const AnnualTimeZoneRule& source)
: TimeZoneRule(source), fDateTimeRule(new DateTimeRule(*(source.fDateTimeRule))),
  fStartYear(source.fStartYear), fEndYear(source.fEndYear) {
}